

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<false> * __thiscall
DefaultState<false>::Float(DefaultState<false> *this,Context<false> *ctx,float f)

{
  pointer pNVar1;
  vw *pvVar2;
  uint64_t uVar3;
  substring sVar4;
  allocator local_45;
  float local_44;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  pNVar1 = (ctx->namespace_path).
           super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar2 = ctx->all;
  local_44 = f;
  std::__cxx11::string::string((string *)&local_40,ctx->key,&local_45);
  sVar4.end = local_40 + local_38;
  sVar4.begin = local_40;
  uVar3 = (*pvVar2->p->hasher)(sVar4,pNVar1[-1].namespace_hash);
  if ((local_44 != 0.0) || (NAN(local_44))) {
    features::push_back(pNVar1[-1].ftrs,local_44,uVar3 & pvVar2->parse_mask);
    pNVar1[-1].feature_count = pNVar1[-1].feature_count + 1;
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    auto& ns = ctx.CurrentNamespace();
    ns.AddFeature(f, VW::hash_feature(*ctx.all, ctx.key, ns.namespace_hash), ctx.key);

    return this;
  }